

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  float fVar1;
  uint i_00;
  ImFontGlyph *pIVar2;
  float *pfVar3;
  unsigned_short *puVar4;
  ImFontGlyph *__src;
  int iVar5;
  float local_58;
  int local_34;
  int i_2;
  ImFontGlyph *tab_glyph;
  int page_n;
  int codepoint;
  int i_1;
  int i;
  int max_codepoint;
  ImFont *this_local;
  
  i_1 = 0;
  for (codepoint = 0; codepoint != (this->Glyphs).Size; codepoint = codepoint + 1) {
    pIVar2 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,codepoint);
    i_1 = ImMax<int>(i_1,*(uint *)pIVar2 & 0x7fffffff);
  }
  if ((this->Glyphs).Size < 0xffff) {
    ImVector<float>::clear(&this->IndexAdvanceX);
    ImVector<unsigned_short>::clear(&this->IndexLookup);
    this->DirtyLookupTables = false;
    memset(this->Used4kPagesMap,0,2);
    GrowIndex(this,i_1 + 1);
    for (page_n = 0; page_n < (this->Glyphs).Size; page_n = page_n + 1) {
      pIVar2 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,page_n);
      i_00 = *(uint *)pIVar2 & 0x7fffffff;
      pIVar2 = ImVector<ImFontGlyph>::operator[](&this->Glyphs,page_n);
      fVar1 = pIVar2->AdvanceX;
      pfVar3 = ImVector<float>::operator[](&this->IndexAdvanceX,i_00);
      *pfVar3 = fVar1;
      puVar4 = ImVector<unsigned_short>::operator[](&this->IndexLookup,i_00);
      *puVar4 = (unsigned_short)page_n;
      iVar5 = (int)(i_00 / 0x1000) >> 3;
      this->Used4kPagesMap[iVar5] =
           this->Used4kPagesMap[iVar5] | (byte)(1 << ((byte)(i_00 / 0x1000) & 7));
    }
    pIVar2 = FindGlyph(this,0x20);
    if (pIVar2 != (ImFontGlyph *)0x0) {
      pIVar2 = ImVector<ImFontGlyph>::back(&this->Glyphs);
      if (((undefined1  [40])*pIVar2 & (undefined1  [40])0x7fffffff) != (undefined1  [40])0x9) {
        ImVector<ImFontGlyph>::resize(&this->Glyphs,(this->Glyphs).Size + 1);
      }
      pIVar2 = ImVector<ImFontGlyph>::back(&this->Glyphs);
      __src = FindGlyph(this,0x20);
      memcpy(pIVar2,__src,0x28);
      *(uint *)pIVar2 = *(uint *)pIVar2 & 0x80000000 | 9;
      pIVar2->AdvanceX = pIVar2->AdvanceX * 4.0;
      fVar1 = pIVar2->AdvanceX;
      pfVar3 = ImVector<float>::operator[](&this->IndexAdvanceX,*(uint *)pIVar2 & 0x7fffffff);
      *pfVar3 = fVar1;
      iVar5 = (this->Glyphs).Size;
      puVar4 = ImVector<unsigned_short>::operator[](&this->IndexLookup,*(uint *)pIVar2 & 0x7fffffff)
      ;
      *puVar4 = (short)iVar5 - 1;
    }
    SetGlyphVisible(this,0x20,false);
    SetGlyphVisible(this,9,false);
    pIVar2 = FindGlyphNoFallback(this,this->FallbackChar);
    this->FallbackGlyph = pIVar2;
    if (this->FallbackGlyph == (ImFontGlyph *)0x0) {
      local_58 = 0.0;
    }
    else {
      local_58 = this->FallbackGlyph->AdvanceX;
    }
    this->FallbackAdvanceX = local_58;
    for (local_34 = 0; local_34 < i_1 + 1; local_34 = local_34 + 1) {
      pfVar3 = ImVector<float>::operator[](&this->IndexAdvanceX,local_34);
      if (*pfVar3 <= 0.0 && *pfVar3 != 0.0) {
        fVar1 = this->FallbackAdvanceX;
        pfVar3 = ImVector<float>::operator[](&this->IndexAdvanceX,local_34);
        *pfVar3 = fVar1;
      }
    }
    return;
  }
  __assert_fail("Glyphs.Size < 0xFFFF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                ,0xb57,"void ImFont::BuildLookupTable()");
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    // Build lookup table
    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexAdvanceX.clear();
    IndexLookup.clear();
    DirtyLookupTables = false;
    memset(Used4kPagesMap, 0, sizeof(Used4kPagesMap));
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexAdvanceX[codepoint] = Glyphs[i].AdvanceX;
        IndexLookup[codepoint] = (ImWchar)i;

        // Mark 4K page as used
        const int page_n = codepoint / 4096;
        Used4kPagesMap[page_n >> 3] |= 1 << (page_n & 7);
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((ImWchar)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times (FIXME: Flaky)
            Glyphs.resize(Glyphs.Size + 1);
        ImFontGlyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((ImWchar)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.AdvanceX *= IM_TABSIZE;
        IndexAdvanceX[(int)tab_glyph.Codepoint] = (float)tab_glyph.AdvanceX;
        IndexLookup[(int)tab_glyph.Codepoint] = (ImWchar)(Glyphs.Size - 1);
    }

    // Mark special glyphs as not visible (note that AddGlyph already mark as non-visible glyphs with zero-size polygons)
    SetGlyphVisible((ImWchar)' ', false);
    SetGlyphVisible((ImWchar)'\t', false);

    // Setup fall-backs
    FallbackGlyph = FindGlyphNoFallback(FallbackChar);
    FallbackAdvanceX = FallbackGlyph ? FallbackGlyph->AdvanceX : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexAdvanceX[i] < 0.0f)
            IndexAdvanceX[i] = FallbackAdvanceX;
}